

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

int big_block_get_attr(BigBlock *block,char *attrname,void *data,char *dtype,int nmemb)

{
  int iVar1;
  BigAttr *pBVar2;
  char *msg;
  
  pBVar2 = attrset_lookup_attr(block->attrset,attrname);
  if (pBVar2 == (BigAttr *)0x0) {
    msg = "attr not found";
    iVar1 = 0x6de;
  }
  else {
    if (pBVar2->nmemb == nmemb) {
      iVar1 = dtype_convert_simple(data,dtype,pBVar2->data,pBVar2->dtype,(long)nmemb);
      return iVar1;
    }
    msg = "attr nmemb mismatch";
    iVar1 = 0x6df;
  }
  _big_file_raise(msg,
                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                  ,iVar1);
  return -1;
}

Assistant:

int
big_block_get_attr(BigBlock * block, const char * attrname, void * data, const char * dtype, int nmemb)
{
    return attrset_get_attr(block->attrset, attrname, data, dtype, nmemb);
}